

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::accessChainStore
          (TGlslangToSpvTraverser *this,TType *type,Id rvalue)

{
  Builder *this_00;
  AccessChain *pAVar1;
  Op OVar2;
  Instruction *pIVar3;
  int iVar4;
  Id typeId;
  Id IVar5;
  Id IVar6;
  CoherentFlags CVar7;
  uint uVar8;
  Decoration nonUniform;
  MemoryAccessMask MVar9;
  Scope scope;
  TType *type_00;
  Id local_9c;
  CoherentFlags coherentFlags;
  AccessChain local_88;
  
  iVar4 = (*type->_vptr_TType[7])(type);
  local_9c = rvalue;
  if (iVar4 != 0xc) goto LAB_003c1845;
  this_00 = &this->builder;
  typeId = spv::Builder::accessChainGetInferredType(this_00);
  OVar2 = (this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[typeId]->opCode;
  if (OVar2 - OpTypeBool < 3) {
    IVar5 = spv::Builder::makeBoolType(this_00);
    if (typeId != IVar5) {
      IVar5 = spv::Builder::makeUintConstant(this_00,1,false);
      IVar6 = spv::Builder::makeUintConstant(this_00,0,false);
LAB_003c17e3:
      local_9c = spv::Builder::createTriOp(this_00,OpSelect,typeId,rvalue,IVar5,IVar6);
      goto LAB_003c1845;
    }
    pIVar3 = (this->builder).module.idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[rvalue];
    if (pIVar3 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar3->typeId;
    }
    if (IVar5 == typeId) goto LAB_003c1845;
    IVar5 = spv::Builder::makeUintConstant(this_00,0,false);
  }
  else {
    if (OVar2 != OpTypeVector) goto LAB_003c1845;
    uVar8 = spv::Builder::getNumTypeConstituents(this_00,typeId);
    IVar5 = spv::Builder::makeBoolType(this_00);
    IVar5 = spv::Builder::makeVectorType(this_00,IVar5,uVar8);
    if (typeId != IVar5) {
      IVar5 = spv::Builder::makeUintConstant(this_00,1,false);
      IVar5 = makeSmearedConstant(this,IVar5,uVar8);
      IVar6 = spv::Builder::makeUintConstant(this_00,0,false);
      IVar6 = makeSmearedConstant(this,IVar6,uVar8);
      goto LAB_003c17e3;
    }
    pIVar3 = (this->builder).module.idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[rvalue];
    if (pIVar3 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar3->typeId;
    }
    if (IVar5 == typeId) goto LAB_003c1845;
    IVar5 = spv::Builder::makeUintConstant(this_00,0,false);
    IVar5 = makeSmearedConstant(this,IVar5,uVar8);
  }
  local_9c = spv::Builder::createBinOp(this_00,OpINotEqual,typeId,rvalue,IVar5);
LAB_003c1845:
  pAVar1 = &(this->builder).accessChain;
  type_00 = (TType *)pAVar1;
  spv::Builder::AccessChain::AccessChain(&local_88,pAVar1);
  coherentFlags = local_88.coherentFlags;
  spv::Builder::AccessChain::~AccessChain(&local_88);
  CVar7 = TranslateCoherent((TGlslangToSpvTraverser *)type,type_00);
  local_88.base._0_2_ = CVar7._0_2_;
  spv::Builder::AccessChain::CoherentFlags::operator|=(&coherentFlags,(CoherentFlags *)&local_88);
  spv::Builder::AccessChain::AccessChain(&local_88,pAVar1);
  spv::Builder::AccessChain::~AccessChain(&local_88);
  uVar8 = glslang::TType::getBufferReferenceAlignment(type);
  spv::Builder::AccessChain::AccessChain(&local_88,pAVar1);
  nonUniform = TranslateNonUniformDecoration(this,&local_88.coherentFlags);
  MVar9 = TranslateMemoryAccess(this,&coherentFlags);
  scope = TranslateMemoryScope(this,&coherentFlags);
  spv::Builder::accessChainStore
            (&this->builder,local_9c,nonUniform,MVar9 & ~MakePointerVisible,scope,
             local_88.alignment | uVar8);
  spv::Builder::AccessChain::~AccessChain(&local_88);
  return;
}

Assistant:

void TGlslangToSpvTraverser::accessChainStore(const glslang::TType& type, spv::Id rvalue)
{
    // Need to convert to abstract types when necessary
    if (type.getBasicType() == glslang::EbtBool) {
        spv::Id nominalTypeId = builder.accessChainGetInferredType();

        if (builder.isScalarType(nominalTypeId)) {
            // Conversion for bool
            spv::Id boolType = builder.makeBoolType();
            if (nominalTypeId != boolType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = builder.makeUintConstant(1);
                spv::Id zero = builder.makeUintConstant(0);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != boolType)
                rvalue = builder.createBinOp(spv::OpINotEqual, boolType, rvalue, builder.makeUintConstant(0));
        } else if (builder.isVectorType(nominalTypeId)) {
            // Conversion for bvec
            int vecSize = builder.getNumTypeComponents(nominalTypeId);
            spv::Id bvecType = builder.makeVectorType(builder.makeBoolType(), vecSize);
            if (nominalTypeId != bvecType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = makeSmearedConstant(builder.makeUintConstant(1), vecSize);
                spv::Id zero = makeSmearedConstant(builder.makeUintConstant(0), vecSize);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != bvecType)
                rvalue = builder.createBinOp(spv::OpINotEqual, bvecType, rvalue,
                                             makeSmearedConstant(builder.makeUintConstant(0), vecSize));
        }
    }

    spv::Builder::AccessChain::CoherentFlags coherentFlags = builder.getAccessChain().coherentFlags;
    coherentFlags |= TranslateCoherent(type);

    unsigned int alignment = builder.getAccessChain().alignment;
    alignment |= type.getBufferReferenceAlignment();

    builder.accessChainStore(rvalue, TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags),
                             spv::MemoryAccessMask(TranslateMemoryAccess(coherentFlags) &
                                ~spv::MemoryAccessMakePointerVisibleKHRMask),
                             TranslateMemoryScope(coherentFlags), alignment);
}